

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cKHRDebugTests.cpp
# Opt level: O2

int __thiscall gl4cts::KHRDebugTests::init(KHRDebugTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  APIErrorsTest *pAVar1;
  LabelsTest *pLVar2;
  ReceiveingMessagesTest *this_00;
  GroupsTest *this_01;
  SynchronousCallsTest *this_02;
  
  pAVar1 = (APIErrorsTest *)operator_new(0xa8);
  KHRDebug::APIErrorsTest::APIErrorsTest
            (pAVar1,(this->super_TestCaseGroup).m_context,false,"api_errors_non_debug");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pLVar2 = (LabelsTest *)operator_new(0xa8);
  KHRDebug::LabelsTest::LabelsTest
            (pLVar2,(this->super_TestCaseGroup).m_context,false,"labels_non_debug");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  this_00 = (ReceiveingMessagesTest *)operator_new(0xa8);
  KHRDebug::ReceiveingMessagesTest::ReceiveingMessagesTest
            (this_00,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (GroupsTest *)operator_new(0xa8);
  KHRDebug::GroupsTest::GroupsTest(this_01,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  pAVar1 = (APIErrorsTest *)operator_new(0xa8);
  KHRDebug::APIErrorsTest::APIErrorsTest
            (pAVar1,(this->super_TestCaseGroup).m_context,true,"api_errors_debug");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pLVar2 = (LabelsTest *)operator_new(0xa8);
  KHRDebug::LabelsTest::LabelsTest(pLVar2,(this->super_TestCaseGroup).m_context,true,"labels_debug")
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  this_02 = (SynchronousCallsTest *)operator_new(0xb8);
  KHRDebug::SynchronousCallsTest::SynchronousCallsTest
            (this_02,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  return extraout_EAX;
}

Assistant:

void KHRDebugTests::init(void)
{
	addChild(new KHRDebug::APIErrorsTest(m_context, false, "api_errors_non_debug"));
	addChild(new KHRDebug::LabelsTest(m_context, false, "labels_non_debug"));
	addChild(new KHRDebug::ReceiveingMessagesTest(m_context));
	addChild(new KHRDebug::GroupsTest(m_context));
	addChild(new KHRDebug::APIErrorsTest(m_context, true, "api_errors_debug"));
	addChild(new KHRDebug::LabelsTest(m_context, true, "labels_debug"));
	addChild(new KHRDebug::SynchronousCallsTest(m_context));
}